

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

int lua_pcall(lua_State *L,int nargs,int nresults,int errfunc)

{
  byte bVar1;
  uint64_t uVar2;
  int iVar3;
  TValue *pTVar4;
  long lVar5;
  
  uVar2 = (L->glref).ptr64;
  bVar1 = *(byte *)(uVar2 + 0x91);
  if (errfunc == 0) {
    lVar5 = 0;
  }
  else {
    pTVar4 = index2adr_stack(L,errfunc);
    lVar5 = (long)pTVar4 - (L->stack).ptr64;
  }
  pTVar4 = api_call_base(L,nargs);
  iVar3 = lj_vm_pcall(L,pTVar4,nresults + 1,lVar5);
  if (iVar3 != 0) {
    *(byte *)(uVar2 + 0x91) = *(byte *)(uVar2 + 0x91) & 0xf | bVar1 & 0xf0;
  }
  return iVar3;
}

Assistant:

LUA_API int lua_pcall(lua_State *L, int nargs, int nresults, int errfunc)
{
  global_State *g = G(L);
  uint8_t oldh = hook_save(g);
  ptrdiff_t ef;
  int status;
  lj_checkapi(L->status == LUA_OK || L->status == LUA_ERRERR,
	      "thread called in wrong state %d", L->status);
  lj_checkapi_slot(nargs+1);
  if (errfunc == 0) {
    ef = 0;
  } else {
    cTValue *o = index2adr_stack(L, errfunc);
    ef = savestack(L, o);
  }
  status = lj_vm_pcall(L, api_call_base(L, nargs), nresults+1, ef);
  if (status) hook_restore(g, oldh);
  return status;
}